

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

short duckdb::DecimalScaleDownOperator::Operation<long,short>
                (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  long lVar2;
  DecimalScaleInput<long,_long> *data;
  
  lVar2 = input / (*(long *)((long)dataptr + 0x28) / 2);
  sVar1 = Cast::Operation<long,short>((long)(lVar2 + (lVar2 >> 0x3f | 1U)) / 2);
  return sVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}